

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O1

Status soplex::primalColStatus<double>(int i,SPxLPBase<double> *theLP)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Status SVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  
  dVar1 = (theLP->super_LPColSetBase<double>).up.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  ::soplex::infinity::__tls_init();
  dVar2 = *(double *)(in_FS_OFFSET + -8);
  dVar3 = (theLP->super_LPColSetBase<double>).low.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  if (dVar2 <= dVar1) {
    ::soplex::infinity::__tls_init();
    SVar4 = -(uint)(dVar3 <= -dVar2);
  }
  else {
    ::soplex::infinity::__tls_init();
    if (dVar3 <= -dVar2) {
      return P_ON_UPPER;
    }
    dVar1 = (theLP->super_LPColSetBase<double>).low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    dVar2 = (theLP->super_LPColSetBase<double>).up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
      return P_FIXED;
    }
    dVar3 = (theLP->super_LPColSetBase<double>).object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      bVar6 = dVar3 == 0.0;
      bVar5 = 0.0 < dVar3;
    }
    else {
      bVar6 = dVar2 == -dVar1;
      bVar5 = dVar2 < -dVar1;
    }
    SVar4 = (uint)(bVar5 || bVar6) * 2;
  }
  return SVar4 | P_ON_LOWER;
}

Assistant:

static typename SPxBasisBase<R>::Desc::Status
primalColStatus(int i, const SPxLPBase<R>* theLP)
{
   assert(theLP != nullptr);

   if(theLP->upper(i) < R(infinity))
   {
      if(theLP->lower(i) > R(-infinity))
      {
         if(theLP->lower(i) == theLP->SPxLPBase<R>::upper(i))
            return SPxBasisBase<R>::Desc::P_FIXED;
         /*
           else
           return (-theLP->lower(i) < theLP->upper(i))
           ? SPxBasisBase<R>::Desc::P_ON_LOWER
           : SPxBasisBase<R>::Desc::P_ON_UPPER;
         */
         else if(theLP->maxObj(i) == 0)
            return (-theLP->lower(i) < theLP->upper(i))
                   ? SPxBasisBase<R>::Desc::P_ON_LOWER
                   : SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            return (theLP->maxObj(i) < 0)
                   ? SPxBasisBase<R>::Desc::P_ON_LOWER
                   : SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
      else
         return SPxBasisBase<R>::Desc::P_ON_UPPER;
   }
   else if(theLP->lower(i) > R(-infinity))
      return SPxBasisBase<R>::Desc::P_ON_LOWER;
   else
      return SPxBasisBase<R>::Desc::P_FREE;
}